

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

void __thiscall
BayesianGameForDecPOMDPStage::Fill_joI_Array
          (BayesianGameForDecPOMDPStage *this,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI,Index *joI_arr)

{
  pointer *this_00;
  long lVar1;
  int iVar2;
  Index IVar3;
  undefined4 extraout_var;
  const_reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  size_type *psVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffec8;
  PlanningUnitDecPOMDPDiscrete *this_01;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  allocator_type *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  value_type vVar8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffef0;
  undefined8 local_f8;
  Index local_ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff18;
  size_type *psVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff20;
  uint local_a8;
  uint local_a4;
  Index tI_1;
  Index tI;
  unsigned_long __vla_expr0;
  uint local_8c;
  Index agentI;
  undefined1 local_60 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  indivObservations;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indOHI;
  Index *joI_arr_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes_local;
  Index ts_local;
  BayesianGameForDecPOMDPStage *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  (*(this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
    super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
    super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])
            (&this->super_BayesianGameIdenticalPayoff);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8b6aa1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffef0,
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0
            );
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x8b6aca);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
           (value_type *)in_stack_fffffffffffffee0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x8b6af0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffee0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8b6b02);
  local_8c = 0;
  while( true ) {
    uVar6 = (ulong)local_8c;
    iVar2 = (*(this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
              super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])
                      (&this->super_BayesianGameIdenticalPayoff);
    if (CONCAT44(extraout_var,iVar2) <= uVar6) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (firstOHtsI,(ulong)local_8c);
    vVar8 = *pvVar4;
    this_00 = &indivObservations.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                        (ulong)local_8c);
    *pvVar5 = *pvVar5 + vVar8;
    lVar1 = -((ulong)ts * 4 + 0xf & 0xfffffffffffffff0);
    psVar7 = (size_type *)(&stack0xfffffffffffffec8 + lVar1);
    psVar9 = psVar7;
    *(undefined8 *)(&stack0xfffffffffffffec0 + lVar1) = 0x8b6bf0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(ulong)local_8c);
    *(undefined8 *)(&stack0xfffffffffffffec0 + lVar1) = 0x8b6c0e;
    PlanningUnitMADPDiscrete::GetObservationHistoryArrays
              (*(PlanningUnitMADPDiscrete **)(&stack0xffffffffffffff20 + lVar1),
               *(Index *)(&stack0xffffffffffffff1c + lVar1),
               *(Index *)(&stack0xffffffffffffff18 + lVar1),*(Index *)((long)&local_ec + lVar1),
               *(Index **)((long)&local_f8 + lVar1));
    for (local_a4 = 0; local_a4 < ts; local_a4 = local_a4 + 1) {
      vVar8 = *(value_type *)((long)psVar9 + (ulong)local_a4 * 4);
      *(undefined8 *)(&stack0xfffffffffffffec0 + lVar1) = 0x8b6c4a;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::at(*(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             **)(&stack0xfffffffffffffed0 + lVar1),*psVar7);
      *(undefined8 *)(&stack0xfffffffffffffec0 + lVar1) = 0x8b6c67;
      in_stack_fffffffffffffee0 =
           (allocator_type *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                       (&stack0xfffffffffffffed0 + lVar1),*psVar7);
      *(value_type *)in_stack_fffffffffffffee0 = vVar8;
    }
    local_8c = local_8c + 1;
  }
  for (local_a8 = 0; local_a8 < ts; local_a8 = local_a8 + 1) {
    this_01 = this->_m_pu;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)local_60,(ulong)local_a8);
    IVar3 = PlanningUnitMADPDiscrete::IndividualToJointObservationIndices
                      (&this_01->super_PlanningUnitMADPDiscrete,in_stack_fffffffffffffec8);
    joI_arr[local_a8] = IVar3;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)in_stack_fffffffffffffee0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

void BayesianGameForDecPOMDPStage::Fill_joI_Array(const Index ts, 
        const vector<Index>& indTypes, 
        const vector<Index>& firstOHtsI, 
        Index* joI_arr)
{           
    //convert indiv type indices to ind. observation history indices:
    vector<Index> indOHI = vector<Index>(indTypes);
    // indivObservations[ti][agI]  will contain the observation agI received at tI+1
    vector< vector<Index> > indivObservations(ts,vector<Index>(GetNrAgents()) );
    for(Index agentI=0; agentI < GetNrAgents(); agentI++)
    {
        indOHI[agentI] += firstOHtsI[agentI];
        Index obsArr[ts];
        _m_pu->GetObservationHistoryArrays(agentI, indOHI[agentI], ts, obsArr);
        //now obsArr is filled and can be copied into indivObservations
        for(Index tI=0; tI < ts; tI++)
            indivObservations.at(tI).at(agentI) = obsArr[tI];
    }

    for(Index tI=0; tI < ts; tI++)
        joI_arr[tI] = _m_pu->IndividualToJointObservationIndices(
                indivObservations[tI] );
}